

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers_test.cpp
# Opt level: O0

void __thiscall HashMap_Randoms_Test::~HashMap_Randoms_Test(HashMap_Randoms_Test *this)

{
  void *in_RDI;
  
  ~HashMap_Randoms_Test((HashMap_Randoms_Test *)0x5a6078);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(HashMap, Randoms) {
    Allocator alloc;
    HashMap<int, int, std::hash<int>> map(alloc);
    std::set<int> values;
    RNG rng(1234);

    for (int i = 0; i < 10000; ++i) {
        int v = rng.Uniform<int>();
        values.insert(v);
        map.Insert(v, -v);
    }

    // Could have a collision so thus less...
    EXPECT_EQ(map.size(), values.size());

    // Reset
    rng.SetSequence(1234);
    for (int i = 0; i < 10000; ++i) {
        int v = rng.Uniform<int>();
        ASSERT_TRUE(map.HasKey(v));
        EXPECT_EQ(-v, map[v]);
    }

    int nVisited = 0;
    for (auto iter = map.begin(); iter != map.end(); ++iter) {
        ++nVisited;

        EXPECT_EQ(iter->first, -iter->second);

        int v = iter->first;
        auto siter = values.find(v);
        ASSERT_NE(siter, values.end());
        values.erase(siter);
    }

    EXPECT_EQ(nVisited, 10000);
    EXPECT_EQ(0, values.size());
}